

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsetable_unittests.cc
# Opt level: O3

void __thiscall Sparsetable_Int_Test::~Sparsetable_Int_Test(Sparsetable_Int_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Sparsetable, Int) {
  sparsetable<int> x(7), y(70), z;
  x.set(4, 10);
  y.set(12, -12);
  y.set(47, -47);
  y.set(48, -48);
  y.set(49, -49);

  const sparsetable<int> constx(x);
  const sparsetable<int> consty(y);

  // ----------------------------------------------------------------------
  // Test the plain iterators

  ASSERT_THAT(ToVector(x.begin(), x.end()), ElementsAre(0, 0, 0, 0, 10, 0, 0));

  ASSERT_THAT(ToVector(constx.begin(), constx.end()),
              ElementsAre(0, 0, 0, 0, 10, 0, 0));

  ASSERT_THAT(ToVector(x.rbegin(), x.rend()),
              ElementsAre(0, 0, 10, 0, 0, 0, 0));

  ASSERT_THAT(ToVector(constx.rbegin(), constx.rend()),
              ElementsAre(0, 0, 10, 0, 0, 0, 0));

  for (auto it = z.begin(); it != z.end(); ++it) {
    FAIL() << "z should be empty";
  }

  // ----------------------------------------------------------------------
  // array version
  ASSERT_EQ(0, static_cast<int>(x[3]));
  ASSERT_EQ(10, static_cast<int>(x[4]));
  ASSERT_EQ(0, static_cast<int>(x[5]));

  {
    sparsetable<int>::iterator it;  // non-const version
    ASSERT_EQ(10, static_cast<int>(x.begin()[4]));
    it = x.begin() + 4;  // should point to the non-zero value
    ASSERT_EQ(10, static_cast<int>(*it));
    it--;
    --it;
    it += 5;
    it -= 2;
    it++;
    ++it;
    it = it - 3;
    it = 1 + it;  // now at 5
    ASSERT_EQ(0, static_cast<int>(it[-2]));
    ASSERT_EQ(10, static_cast<int>(it[-1]));
    *it = 55;
    ASSERT_EQ(55, static_cast<int>(it[0]));
    ASSERT_EQ(55, static_cast<int>(*it));
    int* x6 = &(it[1]);
    *x6 = 66;
    ASSERT_EQ(66, static_cast<int>(*(it + 1)));

    // Let's test comparators as well
    ASSERT_TRUE(it == it);
    ASSERT_TRUE(!(it != it));
    ASSERT_TRUE(!(it < it));
    ASSERT_TRUE(!(it > it));
    ASSERT_TRUE(it <= it);
    ASSERT_TRUE(it >= it);

    sparsetable<int>::iterator it_minus_1 = it - 1;
    ASSERT_TRUE(!(it == it_minus_1));
    ASSERT_TRUE(it != it_minus_1);
    ASSERT_TRUE(!(it < it_minus_1));
    ASSERT_TRUE(it > it_minus_1);
    ASSERT_TRUE(!(it <= it_minus_1));
    ASSERT_TRUE(it >= it_minus_1);
    ASSERT_TRUE(!(it_minus_1 == it));
    ASSERT_TRUE(it_minus_1 != it);
    ASSERT_TRUE(it_minus_1 < it);
    ASSERT_TRUE(!(it_minus_1 > it));
    ASSERT_TRUE(it_minus_1 <= it);
    ASSERT_TRUE(!(it_minus_1 >= it));

    sparsetable<int>::iterator it_plus_1 = it + 1;
    ASSERT_TRUE(!(it == it_plus_1));
    ASSERT_TRUE(it != it_plus_1);
    ASSERT_TRUE(it < it_plus_1);
    ASSERT_TRUE(!(it > it_plus_1));
    ASSERT_TRUE(it <= it_plus_1);
    ASSERT_TRUE(!(it >= it_plus_1));
    ASSERT_TRUE(!(it_plus_1 == it));
    ASSERT_TRUE(it_plus_1 != it);
    ASSERT_TRUE(!(it_plus_1 < it));
    ASSERT_TRUE(it_plus_1 > it);
    ASSERT_TRUE(!(it_plus_1 <= it));
    ASSERT_TRUE(it_plus_1 >= it);
  }
  {
    sparsetable<int>::const_iterator it;  // const version
    ASSERT_EQ(10, static_cast<int>(x.begin()[4]));
    it = x.begin() + 4;  // should point to the non-zero value
    ASSERT_EQ(10, static_cast<int>(*it));
    it--;
    --it;
    it += 5;
    it -= 2;
    it++;
    ++it;
    it = it - 3;
    it = 1 + it;  // now at 5

    ASSERT_EQ(0, it[-2]);
    ASSERT_EQ(10, it[-1]);
    ASSERT_EQ(55, *it);
    ASSERT_EQ(66, *(it + 1));
    // Let's test comparators as well
    ASSERT_TRUE(it == it);
    ASSERT_TRUE(!(it != it));
    ASSERT_TRUE(!(it < it));
    ASSERT_TRUE(!(it > it));
    ASSERT_TRUE(it <= it);
    ASSERT_TRUE(it >= it);

    sparsetable<int>::const_iterator it_minus_1 = it - 1;
    ASSERT_TRUE(!(it == it_minus_1));
    ASSERT_TRUE(it != it_minus_1);
    ASSERT_TRUE(!(it < it_minus_1));
    ASSERT_TRUE(it > it_minus_1);
    ASSERT_TRUE(!(it <= it_minus_1));
    ASSERT_TRUE(it >= it_minus_1);
    ASSERT_TRUE(!(it_minus_1 == it));
    ASSERT_TRUE(it_minus_1 != it);
    ASSERT_TRUE(it_minus_1 < it);
    ASSERT_TRUE(!(it_minus_1 > it));
    ASSERT_TRUE(it_minus_1 <= it);
    ASSERT_TRUE(!(it_minus_1 >= it));

    sparsetable<int>::const_iterator it_plus_1 = it + 1;
    ASSERT_TRUE(!(it == it_plus_1));
    ASSERT_TRUE(it != it_plus_1);
    ASSERT_TRUE(it < it_plus_1);
    ASSERT_TRUE(!(it > it_plus_1));
    ASSERT_TRUE(it <= it_plus_1);
    ASSERT_TRUE(!(it >= it_plus_1));
    ASSERT_TRUE(!(it_plus_1 == it));
    ASSERT_TRUE(it_plus_1 != it);
    ASSERT_TRUE(!(it_plus_1 < it));
    ASSERT_TRUE(it_plus_1 > it);
    ASSERT_TRUE(!(it_plus_1 <= it));
    ASSERT_TRUE(it_plus_1 >= it);
  }

  ASSERT_TRUE(x.begin() == x.begin() + 1 - 1);
  ASSERT_TRUE(x.begin() < x.end());
  ASSERT_FALSE(z.begin() < z.end());  // Wrong in original tests
  ASSERT_TRUE(z.begin() <= z.end());
  ASSERT_TRUE(z.begin() == z.end());

  // ----------------------------------------------------------------------
  // Test the non-empty iterators
  ASSERT_THAT(ToVector(x.nonempty_begin(), x.nonempty_end()),
              ElementsAre(10, 55, 66));

  ASSERT_THAT(
      ToVector(constant(y).nonempty_begin(), constant(y).nonempty_end()),
      ElementsAre(-12, -47, -48, -49));

  ASSERT_THAT(ToVector(y.nonempty_rbegin(), y.nonempty_rend()),
              ElementsAre(-49, -48, -47, -12));

  ASSERT_THAT(ToVector(consty.nonempty_rbegin(), consty.nonempty_rend()),
              ElementsAre(-49, -48, -47, -12));

  for (sparsetable<int>::nonempty_iterator it = z.nonempty_begin();
       it != z.nonempty_end(); ++it) {
    FAIL() << "z should be empty";
  }

  {
    sparsetable<int>::nonempty_iterator it;  // non-const version
    ASSERT_EQ(-12, *y.nonempty_begin());
    ASSERT_EQ(10, *x.nonempty_begin());
    it = x.nonempty_begin();
    ++it;  // should be at end
    --it;
    ASSERT_EQ(10, *it++);
    it--;
    ASSERT_EQ(10, *it++);
  }
  {
    sparsetable<int>::const_nonempty_iterator it;  // const version
    ASSERT_EQ(-12, *y.nonempty_begin());
    ASSERT_EQ(10, *x.nonempty_begin());
    it = x.nonempty_begin();
    ++it;  // should be at end
    --it;
    ASSERT_EQ(10, *it++);
    it--;
    ASSERT_EQ(10, *it++);
  }

  ASSERT_TRUE(x.begin() == x.begin() + 1 - 1);
  ASSERT_TRUE(z.begin() == z.end());

  // ----------------------------------------------------------------------
  // Test the non-empty iterators get_pos function

  sparsetable<unsigned int> gp(100);

  for (std::size_t i = 0; i < 100; i += 9) gp.set(i, i);

  {
    std::vector<unsigned int> v;
    for (auto it = constant(gp).nonempty_begin();
         it != constant(gp).nonempty_end(); ++it)
      v.emplace_back(static_cast<unsigned int>(gp.get_pos(it)));

    ASSERT_THAT(
        v, ElementsAreArray({0, 9, 18, 27, 36, 45, 54, 63, 72, 81, 90, 99}));
  }

  {
    std::vector<unsigned int> v;
    for (auto it = gp.nonempty_begin(); it != gp.nonempty_end(); ++it)
      v.emplace_back(static_cast<unsigned int>(gp.get_pos(it)));
    ASSERT_THAT(
        v, ElementsAreArray({0, 9, 18, 27, 36, 45, 54, 63, 72, 81, 90, 99}));
  }

  // ----------------------------------------------------------------------
  // Test sparsetable functions

  ASSERT_EQ(3UL, x.num_nonempty());
  ASSERT_EQ(7UL, x.size());

  ASSERT_EQ(4UL, y.num_nonempty());
  ASSERT_EQ(70UL, y.size());

  ASSERT_EQ(0UL, z.num_nonempty());
  ASSERT_EQ(0UL, z.size());

  y.resize(48);  // should get rid of 48 and 49
  y.resize(70);  // 48 and 49 should still be gone

  ASSERT_EQ(2UL, y.num_nonempty());
  ASSERT_EQ(70UL, y.size());

  ASSERT_EQ(-12, static_cast<int>(y[12]));
  ASSERT_EQ(-12, y.get(12));

  y.erase(12);

  ASSERT_EQ(1UL, y.num_nonempty());
  ASSERT_EQ(70UL, y.size());

  ASSERT_EQ(0, static_cast<int>(y[12]));
  ASSERT_EQ(0, y.get(12));

  swap(x, y);

  y.clear();
  // TODO: why does this fail?
  // ASSERT_EQ(y, z);

  y.resize(70);
  for (std::size_t i = 10; i < 40; ++i) y[i] = -i;
  y.erase(y.begin() + 15, y.begin() + 30);
  y.erase(y.begin() + 34);
  y.erase(12);
  y.resize(38);
  y.resize(10000);
  y[9898] = -9898;

  {
    std::vector<unsigned int> v;
    for (auto it = constant(y).begin(); it != constant(y).end(); ++it) {
      if (y.test(it)) v.emplace_back(static_cast<unsigned int>(it - y.begin()));
    }
    ASSERT_THAT(v, ElementsAreArray(
                       {10, 11, 13, 14, 30, 31, 32, 33, 35, 36, 37, 9898}));
  }
  ASSERT_EQ(12UL, y.num_nonempty());

  {
    std::vector<unsigned int> v;
    for (auto it = constant(y).get_iter(32); it != constant(y).nonempty_end();
         ++it)
      v.emplace_back(*it);
    ASSERT_THAT(v, ElementsAre(-32, -33, -35, -36, -37, -9898));
  }
  {
    std::vector<unsigned int> v;
    for (auto it = y.get_iter(32); it != y.nonempty_begin();)
      v.emplace_back(*--it);
    ASSERT_THAT(v, ElementsAre(-31, -30, -14, -13, -11, -10));
  }

  // ----------------------------------------------------------------------
  // Test I/O using deprecated read/write_metadata

  {
    auto fp = std::tmpfile();

    ASSERT_TRUE(fp) << "Can't open temp file";

    y.write_metadata(fp);  // only write meta-information
    y.write_nopointer_data(fp);
    std::rewind(fp);

    sparsetable<int> y2;
    y2.read_metadata(fp);
    y2.read_nopointer_data(fp);

    ASSERT_THAT(y, ContainerEq(y2));
    ASSERT_EQ(12UL, y2.num_nonempty());
  }

  // ----------------------------------------------------------------------
  // Also test I/O using serialize()/unserialize()

  {
    auto fp = std::tmpfile();

    ASSERT_TRUE(fp) << "Can't open temp file";

    y.serialize(sparsetable<int>::NopointerSerializer(), fp);

    std::rewind(fp);

    sparsetable<int> y2;
    y2.unserialize(sparsetable<int>::NopointerSerializer(), fp);

    ASSERT_THAT(y, ContainerEq(y2));
    ASSERT_EQ(12UL, y2.num_nonempty());
  }
}